

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_create_from_ctor(JSContext *ctx,JSValue ctor,int class_id)

{
  JSValue func_obj;
  JSValue JVar1;
  int iVar2;
  JSContext *pJVar3;
  int in_ECX;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  JSValue JVar4;
  JSContext *realm;
  JSValue obj;
  JSValue proto;
  undefined1 in_stack_00000098 [16];
  BOOL in_stack_00000120;
  JSContext *in_stack_ffffffffffffff30;
  JSValue in_stack_ffffffffffffff38;
  undefined1 auVar5 [12];
  JSValue in_stack_ffffffffffffff48;
  JSContext *in_stack_ffffffffffffff68;
  JSValueUnion in_stack_ffffffffffffff70;
  int64_t in_stack_ffffffffffffff78;
  undefined4 local_40;
  undefined4 uStack_3c;
  int64_t local_38;
  int64_t local_8;
  
  JVar4.tag = in_RDX;
  JVar4.u.float64 = in_RSI.float64;
  iVar2 = JS_IsUndefined(JVar4);
  if (iVar2 == 0) {
    JVar4 = JS_GetPropertyInternal(ctx,(JSValue)in_stack_00000098,class_id,ctor,in_stack_00000120);
    local_8 = JVar4.tag;
    iVar2 = JS_IsException(JVar4);
    if (iVar2 != 0) {
      local_40 = JVar4.u._0_4_;
      uStack_3c = JVar4.u._4_4_;
      local_38 = local_8;
      goto LAB_00164993;
    }
    iVar2 = JS_IsObject(JVar4);
    if (iVar2 == 0) {
      JS_FreeValue(in_stack_ffffffffffffff30,in_stack_ffffffffffffff38);
      func_obj.tag = in_stack_ffffffffffffff78;
      func_obj.u.float64 = in_stack_ffffffffffffff70.float64;
      pJVar3 = JS_GetFunctionRealm(in_stack_ffffffffffffff68,func_obj);
      if (pJVar3 == (JSContext *)0x0) {
        local_40 = 0;
        local_38 = 6;
        goto LAB_00164993;
      }
      in_stack_ffffffffffffff48 = JS_DupValue(in_RDI,pJVar3->class_proto[in_ECX]);
    }
    auVar5 = in_stack_ffffffffffffff38._4_12_;
  }
  else {
    JS_DupValue(in_RDI,in_RDI->class_proto[in_ECX]);
    auVar5 = in_stack_ffffffffffffff38._4_12_;
  }
  JVar4 = JS_NewObjectProtoClass(auVar5._4_8_,in_stack_ffffffffffffff48,auVar5._0_4_);
  local_38 = JVar4.tag;
  JS_FreeValue(in_stack_ffffffffffffff30,JVar4);
  local_40 = JVar4.u._0_4_;
  uStack_3c = JVar4.u._4_4_;
LAB_00164993:
  JVar1.u._4_4_ = uStack_3c;
  JVar1.u.int32 = local_40;
  JVar1.tag = local_38;
  return JVar1;
}

Assistant:

static JSValue js_create_from_ctor(JSContext *ctx, JSValueConst ctor,
                                   int class_id)
{
    JSValue proto, obj;
    JSContext *realm;
    
    if (JS_IsUndefined(ctor)) {
        proto = JS_DupValue(ctx, ctx->class_proto[class_id]);
    } else {
        proto = JS_GetProperty(ctx, ctor, JS_ATOM_prototype);
        if (JS_IsException(proto))
            return proto;
        if (!JS_IsObject(proto)) {
            JS_FreeValue(ctx, proto);
            realm = JS_GetFunctionRealm(ctx, ctor);
            if (!realm)
                return JS_EXCEPTION;
            proto = JS_DupValue(ctx, realm->class_proto[class_id]);
        }
    }
    obj = JS_NewObjectProtoClass(ctx, proto, class_id);
    JS_FreeValue(ctx, proto);
    return obj;
}